

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void PrintAnswerOut(fstream *fout,vector<int,_std::allocator<int>_> *answer_vector)

{
  int *piVar1;
  ostream *poVar2;
  int *piVar3;
  
  piVar1 = (answer_vector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar3 = (answer_vector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start; piVar3 != piVar1; piVar3 = piVar3 + 1) {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)(fout + 0x10),*piVar3);
    std::operator<<(poVar2," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)(fout + 0x10));
  return;
}

Assistant:

void PrintAnswerOut(std::fstream &fout, std::vector<int> &answer_vector)
{
    for (auto answer : answer_vector) {
        fout << answer << " ";
    }
    fout << std::endl;
}